

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

void nni_http_handler_set_host(nni_http_handler *h,char *host)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [11];
  undefined1 auVar7 [12];
  undefined1 auVar8 [13];
  undefined1 auVar9 [14];
  _Bool _Var10;
  int iVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  undefined1 extraout_XMM0_Be;
  char cVar16;
  undefined1 extraout_XMM0_Bf;
  char cVar17;
  undefined1 extraout_XMM0_Bg;
  char cVar18;
  undefined1 extraout_XMM0_Bh;
  char cVar19;
  undefined1 extraout_XMM0_Bi;
  char cVar20;
  undefined1 extraout_XMM0_Bj;
  char cVar21;
  undefined1 extraout_XMM0_Bk;
  char cVar22;
  undefined1 extraout_XMM0_Bl;
  char cVar23;
  undefined1 extraout_XMM0_Bm;
  char cVar24;
  undefined1 extraout_XMM0_Bn;
  char cVar25;
  undefined1 extraout_XMM0_Bo;
  char cVar26;
  undefined1 extraout_XMM0_Bp;
  byte bVar27;
  uint8_t wild [16];
  char *host_local;
  nni_http_handler *h_local;
  
  _Var10 = nni_atomic_get_bool(&h->busy);
  if (_Var10) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server.c"
              ,0xb9,"!nni_atomic_get_bool(&h->busy)");
  }
  if (((host == (char *)0x0) || (iVar11 = strcmp(host,"*"), iVar11 == 0)) ||
     (iVar11 = strcmp(host,""), iVar11 == 0)) {
    strcpy(h->host,"");
  }
  else {
    iVar11 = nni_parse_ip(host,&h->host_addr);
    if (iVar11 == 0) {
      uVar3 = CONCAT13(extraout_XMM0_Bh,
                       CONCAT12(extraout_XMM0_Bg,CONCAT11(extraout_XMM0_Bf,extraout_XMM0_Be))) ^
              CONCAT13(extraout_XMM0_Bh,
                       CONCAT12(extraout_XMM0_Bg,CONCAT11(extraout_XMM0_Bf,extraout_XMM0_Be)));
      uVar4 = CONCAT13(extraout_XMM0_Bl,
                       CONCAT12(extraout_XMM0_Bk,CONCAT11(extraout_XMM0_Bj,extraout_XMM0_Bi))) ^
              CONCAT13(extraout_XMM0_Bl,
                       CONCAT12(extraout_XMM0_Bk,CONCAT11(extraout_XMM0_Bj,extraout_XMM0_Bi)));
      uVar5 = CONCAT13(extraout_XMM0_Bp,
                       CONCAT12(extraout_XMM0_Bo,CONCAT11(extraout_XMM0_Bn,extraout_XMM0_Bm))) ^
              CONCAT13(extraout_XMM0_Bp,
                       CONCAT12(extraout_XMM0_Bo,CONCAT11(extraout_XMM0_Bn,extraout_XMM0_Bm)));
      if ((h->host_addr).s_family == 3) {
        if ((h->host_addr).s_in.sa_addr == 0) {
          strcpy(h->host,"");
          return;
        }
      }
      else if ((h->host_addr).s_family == 4) {
        cVar12 = -((h->host_addr).s_ipc.sa_path[2] == '\0');
        cVar13 = -((h->host_addr).s_ipc.sa_path[3] == '\0');
        cVar14 = -((h->host_addr).s_ipc.sa_path[4] == '\0');
        cVar15 = -((h->host_addr).s_ipc.sa_path[5] == '\0');
        cVar16 = -((h->host_addr).s_ipc.sa_path[6] == (char)uVar3);
        cVar17 = -((h->host_addr).s_ipc.sa_path[7] == (char)(uVar3 >> 8));
        cVar18 = -((h->host_addr).s_ipc.sa_path[8] == (char)(uVar3 >> 0x10));
        cVar19 = -((h->host_addr).s_ipc.sa_path[9] == (char)(uVar3 >> 0x18));
        cVar20 = -((h->host_addr).s_ipc.sa_path[10] == (char)uVar4);
        cVar21 = -((h->host_addr).s_ipc.sa_path[0xb] == (char)(uVar4 >> 8));
        cVar22 = -((h->host_addr).s_ipc.sa_path[0xc] == (char)(uVar4 >> 0x10));
        cVar23 = -((h->host_addr).s_ipc.sa_path[0xd] == (char)(uVar4 >> 0x18));
        cVar24 = -((h->host_addr).s_ipc.sa_path[0xe] == (char)uVar5);
        cVar25 = -((h->host_addr).s_ipc.sa_path[0xf] == (char)(uVar5 >> 8));
        cVar26 = -((h->host_addr).s_ipc.sa_path[0x10] == (char)(uVar5 >> 0x10));
        bVar27 = -((h->host_addr).s_ipc.sa_path[0x11] == (char)(uVar5 >> 0x18));
        auVar1[1] = cVar13;
        auVar1[0] = cVar12;
        auVar1[2] = cVar14;
        auVar1[3] = cVar15;
        auVar1[4] = cVar16;
        auVar1[5] = cVar17;
        auVar1[6] = cVar18;
        auVar1[7] = cVar19;
        auVar1[8] = cVar20;
        auVar1[9] = cVar21;
        auVar1[10] = cVar22;
        auVar1[0xb] = cVar23;
        auVar1[0xc] = cVar24;
        auVar1[0xd] = cVar25;
        auVar1[0xe] = cVar26;
        auVar1[0xf] = bVar27;
        auVar2[1] = cVar13;
        auVar2[0] = cVar12;
        auVar2[2] = cVar14;
        auVar2[3] = cVar15;
        auVar2[4] = cVar16;
        auVar2[5] = cVar17;
        auVar2[6] = cVar18;
        auVar2[7] = cVar19;
        auVar2[8] = cVar20;
        auVar2[9] = cVar21;
        auVar2[10] = cVar22;
        auVar2[0xb] = cVar23;
        auVar2[0xc] = cVar24;
        auVar2[0xd] = cVar25;
        auVar2[0xe] = cVar26;
        auVar2[0xf] = bVar27;
        auVar9[1] = cVar15;
        auVar9[0] = cVar14;
        auVar9[2] = cVar16;
        auVar9[3] = cVar17;
        auVar9[4] = cVar18;
        auVar9[5] = cVar19;
        auVar9[6] = cVar20;
        auVar9[7] = cVar21;
        auVar9[8] = cVar22;
        auVar9[9] = cVar23;
        auVar9[10] = cVar24;
        auVar9[0xb] = cVar25;
        auVar9[0xc] = cVar26;
        auVar9[0xd] = bVar27;
        auVar8[1] = cVar16;
        auVar8[0] = cVar15;
        auVar8[2] = cVar17;
        auVar8[3] = cVar18;
        auVar8[4] = cVar19;
        auVar8[5] = cVar20;
        auVar8[6] = cVar21;
        auVar8[7] = cVar22;
        auVar8[8] = cVar23;
        auVar8[9] = cVar24;
        auVar8[10] = cVar25;
        auVar8[0xb] = cVar26;
        auVar8[0xc] = bVar27;
        auVar7[1] = cVar17;
        auVar7[0] = cVar16;
        auVar7[2] = cVar18;
        auVar7[3] = cVar19;
        auVar7[4] = cVar20;
        auVar7[5] = cVar21;
        auVar7[6] = cVar22;
        auVar7[7] = cVar23;
        auVar7[8] = cVar24;
        auVar7[9] = cVar25;
        auVar7[10] = cVar26;
        auVar7[0xb] = bVar27;
        auVar6[1] = cVar18;
        auVar6[0] = cVar17;
        auVar6[2] = cVar19;
        auVar6[3] = cVar20;
        auVar6[4] = cVar21;
        auVar6[5] = cVar22;
        auVar6[6] = cVar23;
        auVar6[7] = cVar24;
        auVar6[8] = cVar25;
        auVar6[9] = cVar26;
        auVar6[10] = bVar27;
        if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB141(auVar9 >> 7,0) & 1) << 2 |
                     (ushort)(SUB131(auVar8 >> 7,0) & 1) << 3 |
                     (ushort)(SUB121(auVar7 >> 7,0) & 1) << 4 |
                     (ushort)(SUB111(auVar6 >> 7,0) & 1) << 5 |
                     (ushort)((byte)(CONCAT19(bVar27,CONCAT18(cVar26,CONCAT17(cVar25,CONCAT16(cVar24
                                                  ,CONCAT15(cVar23,CONCAT14(cVar22,CONCAT13(cVar21,
                                                  CONCAT12(cVar20,CONCAT11(cVar19,cVar18))))))))) >>
                                    7) & 1) << 6 |
                     (ushort)((byte)(CONCAT18(bVar27,CONCAT17(cVar26,CONCAT16(cVar25,CONCAT15(cVar24
                                                  ,CONCAT14(cVar23,CONCAT13(cVar22,CONCAT12(cVar21,
                                                  CONCAT11(cVar20,cVar19)))))))) >> 7) & 1) << 7 |
                    (ushort)(bVar27 >> 7) << 0xf) == 0xffff) {
          strcpy(h->host,"");
          return;
        }
      }
      h->host_ip = true;
    }
    snprintf(h->host,0x100,"%s",host);
  }
  return;
}

Assistant:

void
nni_http_handler_set_host(nni_http_handler *h, const char *host)
{
	NNI_ASSERT(!nni_atomic_get_bool(&h->busy));

	if ((host == NULL) || (strcmp(host, "*") == 0) ||
	    strcmp(host, "") == 0) {
		(void) strcpy(h->host, "");
		return;
	}
	if (nni_parse_ip(host, &h->host_addr) == 0) {
		uint8_t wild[16] = { 0 };

		// Check for wild card addresses.
		switch (h->host_addr.s_family) {
		case NNG_AF_INET:
			if (h->host_addr.s_in.sa_addr == 0) {
				(void) strcpy(h->host, "");
				return;
			}
			break;
		case NNG_AF_INET6:
			if (memcmp(h->host_addr.s_in6.sa_addr, wild, 16) ==
			    0) {
				(void) strcpy(h->host, "");
				return;
			}
			break;
		}
		h->host_ip = true;
	}
	(void) snprintf(h->host, sizeof(h->host), "%s", host);
}